

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O1

void Io_NtkWriteSubcktFanins(FILE *pFile,Abc_Obj_t *pNode)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  fprintf((FILE *)pFile," m%d",(ulong)(uint)pNode->Id);
  if ((pNode->vFanins).nSize < 1) {
    bVar7 = true;
    iVar5 = 9;
  }
  else {
    iVar5 = 6;
    lVar6 = 0;
    iVar3 = 0;
    do {
      pcVar1 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar6]]);
      sVar2 = strlen(pcVar1);
      iVar4 = (int)sVar2 + 3;
      if (iVar3 == 0) {
LAB_0033af7e:
        iVar3 = 0;
      }
      else if (0x4b < iVar5 + iVar4) {
        fwrite(" \\\n",3,1,(FILE *)pFile);
        iVar5 = 0;
        goto LAB_0033af7e;
      }
      fprintf((FILE *)pFile," %c=%s",(ulong)((int)lVar6 + 0x61),pcVar1);
      iVar5 = iVar5 + iVar4;
      iVar3 = iVar3 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pNode->vFanins).nSize);
    bVar7 = iVar3 == 0;
    iVar5 = iVar5 + 3;
  }
  pcVar1 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  if (!bVar7) {
    sVar2 = strlen(pcVar1);
    if (0x4b < iVar5 + (int)sVar2) {
      fwrite(" \\\n",3,1,(FILE *)pFile);
    }
  }
  fprintf((FILE *)pFile," %c=%s",0x6f,pcVar1);
  return;
}

Assistant:

void Io_NtkWriteSubcktFanins( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    char * pName;
    int i;

    LineLength  = 6;
    NameCounter = 0;

    // get the output name
    pName = Abc_ObjName(Abc_ObjFanout0(pNode));
    // get the line length after the output name is written
    AddedLength = strlen(pName) + 1;
    fprintf( pFile, " m%d", Abc_ObjId(pNode) );

    // get the input names
    Abc_ObjForEachFanin( pNode, pNet, i )
    {
        // get the fanin name
        pName = Abc_ObjName(pNet);
        // get the line length after the fanin name is written
        AddedLength = strlen(pName) + 3;
        if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
        { // write the line extender
            fprintf( pFile, " \\\n" );
            // reset the line length
            LineLength  = 0;
            NameCounter = 0;
        }
        fprintf( pFile, " %c=%s", 'a'+i, pName );
        LineLength += AddedLength;
        NameCounter++;
    }

    // get the output name
    pName = Abc_ObjName(Abc_ObjFanout0(pNode));
    // get the line length after the output name is written
    AddedLength = strlen(pName) + 3;
    if ( NameCounter && LineLength + AddedLength > 75 )
    { // write the line extender
        fprintf( pFile, " \\\n" );
        // reset the line length
        LineLength  = 0;
        NameCounter = 0;
    }
    fprintf( pFile, " %c=%s", 'o', pName );
}